

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall demo::CaptureLogging::AppendLine(CaptureLogging *this,string *line)

{
  std::mutex::lock(&this->data_lock_);
  std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines_,line);
  pthread_mutex_unlock((pthread_mutex_t *)&this->data_lock_);
  Logging::DefaultAppendLine(line);
  return;
}

Assistant:

void CaptureLogging::AppendLine(const std::string& line) {
  {
    std::lock_guard<std::mutex> lock(data_lock_);
    lines_.emplace_back(line);
  }
  DefaultAppendLine(line);
}